

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.h
# Opt level: O0

void __thiscall OnDiskIndex::OnDiskIndex(OnDiskIndex *this,OnDiskIndex *param_2)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  path *__p;
  
  *in_RDI = *in_RSI;
  __p = (path *)(in_RDI + 1);
  std::__cxx11::string::string((string *)__p,(string *)(in_RSI + 1));
  std::experimental::filesystem::v1::__cxx11::path::path((path *)(in_RDI + 5),__p);
  RawFile::RawFile((RawFile *)(in_RDI + 0xd),(RawFile *)(in_RSI + 0xd));
  *(undefined4 *)((long)in_RDI + 0x6c) = *(undefined4 *)((long)in_RSI + 0x6c);
  return;
}

Assistant:

OnDiskIndex(OnDiskIndex &&) = default;